

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

void __thiscall mathOps_hypot3_Test::TestBody(mathOps_hypot3_Test *this)

{
  precise_measurement *in_R8;
  precise_measurement *val2;
  char *pcVar1;
  AssertionResult gtest_ar_3;
  AssertHelper local_c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  precise_measurement res3;
  precise_measurement res2;
  precise_measurement res;
  precise_measurement m3;
  precise_measurement m2;
  precise_measurement m1;
  
  m1.value_ = 5.0;
  m1.units_.multiplier_ = (double)0x3ff0000000000000;
  m1.units_.base_units_ = (unit_data)0x1;
  m1.units_.commodity_ = 0;
  m2.value_ = 5.4;
  m2.units_.multiplier_ = (double)0x3f9a027525460aa6;
  m2.units_.base_units_ = (unit_data)0x1;
  m2.units_.commodity_ = 0;
  m3.value_ = 0.01;
  m3.units_.multiplier_ = (double)0x408f400000000000;
  m3.units_.base_units_ = (unit_data)0x1;
  m3.units_.commodity_ = 0;
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            (&res,(units *)&m1,&m2,&m3,in_R8);
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)&res2,"res","m1",&res,&m1);
  if (res2.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&res3);
    if (res2.units_.multiplier_ == 0.0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)res2.units_.multiplier_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xb9,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&res3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (res3.value_ != 0.0) {
      (**(code **)(*(long *)res3.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&res2.units_);
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)&res2,"res","m2",&res,&m2);
  if (res2.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&res3);
    if (res2.units_.multiplier_ == 0.0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)res2.units_.multiplier_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xba,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&res3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (res3.value_ != 0.0) {
      (**(code **)(*(long *)res3.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&res2.units_);
  val2 = &m3;
  testing::internal::CmpHelperGT<units::precise_measurement,units::precise_measurement>
            ((internal *)&res2,"res","m3",&res,val2);
  if (res2.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&res3);
    if (res2.units_.multiplier_ == 0.0) {
      val2 = (precise_measurement *)0x16e305;
    }
    else {
      val2 = *(precise_measurement **)res2.units_.multiplier_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbb,(char *)val2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&res3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (res3.value_ != 0.0) {
      (**(code **)(*(long *)res3.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&res2.units_);
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            (&res2,(units *)&m3,&m1,&m2,val2);
  units::
  hypot<units::precise_measurement,units::precise_measurement,units::precise_measurement,void>
            (&res3,(units *)&m2,&m3,&m1,val2);
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)&gtest_ar_3,"res","res2",&res,&res2);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  testing::internal::CmpHelperEQ<units::precise_measurement,units::precise_measurement>
            ((internal *)&gtest_ar_3,"res2","res3",&res2,&res3);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xbf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  return;
}

Assistant:

TEST(mathOps, hypot3)
{
    precise_measurement m1(5.0, precise::m);
    precise_measurement m2(5.4, precise::in);
    precise_measurement m3(0.01, precise::km);
    auto res = hypot(m1, m2, m3);
    EXPECT_GT(res, m1);
    EXPECT_GT(res, m2);
    EXPECT_GT(res, m3);
    auto res2 = hypot(m3, m1, m2);
    auto res3 = hypot(m2, m3, m1);
    EXPECT_EQ(res, res2);
    EXPECT_EQ(res2, res3);
}